

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O0

void __thiscall NLReaderTest_ReadVariable_Test::TestBody(NLReaderTest_ReadVariable_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  bool in_stack_000000d7;
  string *in_stack_000000d8;
  ReadError *e_1;
  bool gtest_caught_expected_1;
  string gtest_expected_message_1;
  AssertionResult gtest_ar_2;
  ReadError *e;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd28;
  char *in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd38;
  int in_stack_fffffffffffffd3c;
  char *in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd48;
  Type in_stack_fffffffffffffd4c;
  AssertionResult *in_stack_fffffffffffffd50;
  undefined7 in_stack_fffffffffffffd58;
  undefined1 in_stack_fffffffffffffd5f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  Message *in_stack_fffffffffffffd98;
  AssertHelper *in_stack_fffffffffffffda0;
  undefined1 local_1e1 [33];
  string local_1c0 [38];
  byte local_19a;
  undefined1 local_199 [33];
  AssertionResult local_178 [3];
  int local_148;
  allocator<char> local_141;
  string local_140 [32];
  string local_120 [38];
  byte local_fa;
  allocator<char> local_f9;
  string local_f8 [32];
  AssertionResult local_d8 [2];
  allocator<char> local_b1;
  string local_b0 [32];
  string local_90 [55];
  allocator<char> local_59;
  string local_58 [32];
  string local_38 [32];
  AssertionResult local_18;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd60,
             (char *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58),
             (allocator<char> *)in_stack_fffffffffffffd50);
  std::operator+(in_stack_fffffffffffffd28,(char *)in_stack_fffffffffffffd20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd60,
             (char *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58),
             (allocator<char> *)in_stack_fffffffffffffd50);
  ReadNL(in_stack_000000d8,in_stack_000000d7);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
             in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd50);
    testing::AssertionResult::failure_message((AssertionResult *)0x14cc3c);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c,
               in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c,in_stack_fffffffffffffd30);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd20);
    testing::Message::~Message((Message *)0x14cc9f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14ccf7);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_d8);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd60,
               (char *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58),
               (allocator<char> *)in_stack_fffffffffffffd50);
    std::allocator<char>::~allocator(&local_f9);
    local_fa = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd60,
                 (char *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58),
                 (allocator<char> *)in_stack_fffffffffffffd50);
      ReadNL(in_stack_000000d8,in_stack_000000d7);
      std::__cxx11::string::~string(local_120);
      std::__cxx11::string::~string(local_140);
      std::allocator<char>::~allocator(&local_141);
    }
    if ((local_fa & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffffd50,
                 (char (*) [98])CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      local_148 = 2;
    }
    else {
      local_148 = 0;
    }
    std::__cxx11::string::~string(local_f8);
    if (local_148 != 0) goto LAB_0014d111;
  }
  else {
LAB_0014d111:
    testing::Message::Message((Message *)in_stack_fffffffffffffd50);
    testing::AssertionResult::failure_message((AssertionResult *)0x14d12d);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c,
               in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c,in_stack_fffffffffffffd30);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd20);
    testing::Message::~Message((Message *)0x14d18a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14d1e2);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_178);
  if (bVar1) {
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_199;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58),
               (allocator<char> *)in_stack_fffffffffffffd50);
    std::allocator<char>::~allocator((allocator<char> *)local_199);
    local_19a = 0;
    uVar2 = testing::internal::AlwaysTrue();
    if ((bool)uVar2) {
      in_stack_fffffffffffffd50 = (AssertionResult *)local_1e1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,(char *)CONCAT17(uVar2,in_stack_fffffffffffffd58),
                 (allocator<char> *)in_stack_fffffffffffffd50);
      ReadNL(in_stack_000000d8,in_stack_000000d7);
      std::__cxx11::string::~string(local_1c0);
      std::__cxx11::string::~string((string *)(local_1e1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_1e1);
    }
    if ((local_19a & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffffd50,
                 (char (*) [97])CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      local_148 = 3;
    }
    else {
      local_148 = 0;
    }
    std::__cxx11::string::~string((string *)(local_199 + 1));
    if (local_148 == 0) goto LAB_0014d68b;
  }
  testing::Message::Message((Message *)in_stack_fffffffffffffd50);
  testing::AssertionResult::failure_message((AssertionResult *)0x14d5e8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c,
             in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c,in_stack_fffffffffffffd30);
  testing::internal::AssertHelper::operator=(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd20);
  testing::Message::~Message((Message *)0x14d643);
LAB_0014d68b:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14d698);
  return;
}

Assistant:

TEST(NLReaderTest, ReadVariable) {
  EXPECT_READ("c0: v4;", "C0\nv4\n");
  EXPECT_READ_ERROR("C0\nv-1\n", "(input):18:2: expected unsigned integer");
  EXPECT_READ_ERROR("C0\nv6\n", "(input):18:2: integer 6 out of bounds");
}